

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O1

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_baryonyx::none_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_baryonyx::none_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,quadratic_cost_type<float> *original_costs,
            double cost_constant)

{
  double dVar1;
  init_policy_type iVar2;
  context *this_00;
  context *ctx;
  undefined8 uVar3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  rep rVar10;
  long lVar11;
  result_status rVar12;
  random_engine *rng;
  int iVar13;
  bit_array_impl *x_optimistic;
  bit_array_impl *x_pessimistic;
  float *in_R9;
  long lVar14;
  ulong uVar15;
  float fVar16;
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  double dVar17;
  undefined1 auVar21 [64];
  double dVar18;
  undefined1 extraout_var_00 [60];
  undefined1 auVar22 [64];
  float fVar23;
  undefined1 auVar24 [16];
  float theta;
  undefined1 auVar25 [12];
  undefined1 in_ZMM3 [64];
  undefined8 in_XMM4_Qb;
  bit_array x;
  float ret;
  quadratic_cost_type<float> norm_costs;
  compute_order compute;
  solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
  slv;
  float local_18c;
  bit_array_impl local_178;
  float local_164;
  double local_160;
  double local_158;
  double local_150;
  quadratic_cost_type<float> *local_148;
  double local_140;
  ulong local_138;
  int local_12c;
  bit_array_impl local_128;
  quadratic_cost_type<float> local_110;
  double local_f0;
  compute_order local_e8;
  solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
  local_b0;
  undefined1 extraout_var [60];
  undefined1 extraout_var_01 [60];
  
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  auVar21 = ZEXT1664(in_ZMM3._0_16_);
  local_140 = cost_constant;
  bit_array_impl::bit_array_impl(&local_178,variables);
  this_00 = this->m_ctx;
  normalize_costs<float,baryonyx::itm::quadratic_cost_type<float>>
            (&local_110,(itm *)this_00,(context *)original_costs,
             (quadratic_cost_type<float> *)this->m_rng,(random_engine *)(ulong)(uint)variables,
             (int)in_R9);
  local_158 = (this_00->parameters).kappa_step;
  local_160 = (this_00->parameters).kappa_max;
  dVar18 = (this_00->parameters).alpha;
  dVar1 = (this_00->parameters).delta;
  theta = (float)(this_00->parameters).theta;
  if (0.0 <= dVar1) {
    local_18c = (float)dVar1;
  }
  else {
    ctx = this->m_ctx;
    local_b0.super_debug_logger<true>.ofs._0_4_ = theta;
    info<>(ctx,"  - delta not defined, compute it:\n");
    auVar20._0_4_ = quadratic_cost_type<float>::min(&local_110,variables);
    auVar20._4_60_ = extraout_var;
    auVar19 = vfnmadd132ss_fma(auVar20._0_16_,auVar20._0_16_,
                               ZEXT416((uint)local_b0.super_debug_logger<true>.ofs._0_4_));
    local_128.m_size = auVar19._0_4_;
    local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = auVar20._0_4_;
    info<float,float,float>
              ((baryonyx *)ctx,(context *)"    - delta={} (min normalized cost:{} / theta: {})\n",
               (char *)&local_128,(float *)&local_e8,(float *)&local_b0,in_R9);
    local_18c = (float)local_128.m_size;
  }
  local_150 = (this_00->parameters).pushing_k_factor;
  local_f0 = (this_00->parameters).pushing_objective_amplifier;
  local_138 = (ulong)(this_00->parameters).w;
  solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
  ::solver_inequalities_01coeff
            (&local_b0,this->m_rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_110,constraints);
  compute_order::compute_order(&local_e8,(this_00->parameters).order,variables);
  dVar1 = (this->m_ctx->parameters).init_policy_random;
  local_128.m_size = 0;
  local_128.m_block_size = 0;
  local_128.m_data._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
  iVar2 = (this_00->parameters).init_policy;
  if (iVar2 == bastert) {
    init_with_bastert<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>
              ((bit_array *)&local_178,original_costs,variables,0);
  }
  else {
    if (iVar2 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = &local_178;
      x_optimistic = &local_128;
    }
    else {
      if (iVar2 != optimistic_solve) goto LAB_00385e2c;
      rng = this->m_rng;
      x_pessimistic = &local_128;
      x_optimistic = &local_178;
    }
    init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_00385e2c:
  auVar25 = auVar21._4_12_;
  local_148 = original_costs;
  if (local_178.m_size != 0) {
    iVar13 = 0;
    do {
      dVar17 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (this->m_rng);
      if (dVar17 < dVar1) {
        bit_array_impl::invert(&local_178,iVar13);
      }
      auVar25 = auVar21._4_12_;
      iVar13 = iVar13 + 1;
    } while (local_178.m_size != iVar13);
  }
  if (local_128.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)local_128.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  dVar1 = (this_00->parameters).kappa_min;
  rVar10 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar10;
  rVar10 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar10;
  compute_order::
  init<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array>
            (&local_e8,&local_b0,(bit_array *)&local_178);
  local_164 = (float)local_158;
  local_158 = (double)CONCAT44(local_158._4_4_,(float)local_160);
  local_160 = (double)CONCAT44(local_160._4_4_,(float)dVar18);
  auVar21 = ZEXT1664(CONCAT124(auVar25,(float)dVar1));
  local_12c = variables;
  if ((this_00->parameters).limit == 0) {
    bVar6 = false;
  }
  else {
    iVar13 = 0x7fffffff;
    lVar14 = 0;
    bVar6 = false;
    do {
      fVar23 = auVar21._0_4_;
      iVar7 = compute_order::
              run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,float>
                        (&local_e8,&local_b0,(bit_array *)&local_178,this->m_rng,fVar23,local_18c,
                         theta);
      if (iVar7 == 0) {
        dVar18 = quadratic_cost_type<float>::results(local_148,(bit_array *)&local_178,local_140);
        store_if_better(this,(bit_array *)&local_178,dVar18,lVar14);
        bVar6 = true;
        iVar13 = 0;
        bVar5 = false;
LAB_00385fb8:
        auVar21 = ZEXT464((uint)fVar23);
      }
      else {
        if (iVar7 < iVar13) {
          store_if_better(this,(bit_array *)&local_178,iVar7,lVar14);
          iVar13 = iVar7;
        }
        if ((long)local_138 < lVar14) {
          auVar21._0_4_ = powf((float)iVar7 / (float)local_b0.m,local_160._0_4_);
          auVar21._4_60_ = extraout_var_00;
          auVar19 = vfmadd231ss_fma(ZEXT416((uint)fVar23),auVar21._0_16_,ZEXT416((uint)local_164));
          auVar21 = ZEXT1664(auVar19);
        }
        else {
          auVar21 = ZEXT464((uint)fVar23);
        }
        rVar12 = kappa_max_reached;
        fVar23 = auVar21._0_4_;
        if (local_158._0_4_ < fVar23) {
LAB_00386029:
          __return_storage_ptr__->status = rVar12;
          bVar5 = false;
        }
        else {
          lVar11 = std::chrono::_V2::steady_clock::now();
          (this->m_end).__d.__r = lVar11;
          dVar18 = (this->m_ctx->parameters).time_limit;
          bVar5 = true;
          if (dVar18 <= 0.0) goto LAB_00385fb8;
          rVar12 = time_limit_reached;
          auVar21 = ZEXT464((uint)fVar23);
          if (dVar18 < (double)(lVar11 - (this->m_begin).__d.__r) / 1000000000.0) goto LAB_00386029;
        }
      }
    } while ((bVar5) && (lVar14 = lVar14 + 1, lVar14 != (this_00->parameters).limit));
  }
  if (bVar6) {
    if (0 < (this_00->parameters).pushes_limit) {
      fVar23 = (float)local_150;
      local_150 = (double)CONCAT44(local_150._4_4_,(float)local_f0);
      iVar13 = 0;
      iVar7 = 0;
      do {
        fVar16 = auVar21._0_4_;
        iVar8 = compute_order::
                push_and_run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,float>
                          (&local_e8,&local_b0,(bit_array *)&local_178,this->m_rng,fVar16 * fVar23,
                           local_18c,theta,local_150._0_4_);
        if (iVar8 == 0) {
          dVar18 = quadratic_cost_type<float>::results(local_148,(bit_array *)&local_178,local_140);
          store_if_better(this,(bit_array *)&local_178,dVar18,
                          (long)~((this_00->parameters).pushing_iteration_limit * iVar7));
        }
        lVar14 = std::chrono::_V2::steady_clock::now();
        (this->m_end).__d.__r = lVar14;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = (this->m_ctx->parameters).time_limit;
        auVar19._0_8_ = (double)(lVar14 - (this->m_begin).__d.__r) / 1000000000.0;
        auVar19._8_8_ = in_XMM4_Qb;
        uVar3 = vcmppd_avx512vl(auVar24,ZEXT816(0),6);
        uVar15 = vcmppd_avx512vl(auVar24,auVar19,1);
        uVar15 = ((byte)uVar3 & 3) & uVar15;
        local_138 = CONCAT62(local_138._2_6_,(short)uVar15);
        if ((uVar15 & 1) == 0) {
          auVar21 = ZEXT464((uint)fVar16);
          if (0 < (this_00->parameters).pushing_iteration_limit) {
            iVar8 = 1;
            do {
              fVar16 = auVar21._0_4_;
              iVar9 = compute_order::
                      run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,float>
                                (&local_e8,&local_b0,(bit_array *)&local_178,this->m_rng,fVar16,
                                 local_18c,theta);
              if (iVar9 == 0) {
                dVar18 = quadratic_cost_type<float>::results
                                   (local_148,(bit_array *)&local_178,local_140);
                store_if_better(this,(bit_array *)&local_178,dVar18,
                                (long)((this_00->parameters).pushing_iteration_limit * iVar13 -
                                      iVar8));
                auVar21 = ZEXT464((uint)fVar16);
                break;
              }
              if ((double)(iVar8 + -1) <= (this_00->parameters).w) {
                auVar21 = ZEXT464((uint)fVar16);
              }
              else {
                auVar22._0_4_ = powf((float)iVar9 / (float)local_b0.m,local_160._0_4_);
                auVar22._4_60_ = extraout_var_01;
                auVar19 = vfmadd231ss_fma(ZEXT416((uint)fVar16),auVar22._0_16_,
                                          ZEXT416((uint)local_164));
                auVar21 = ZEXT1664(auVar19);
              }
              fVar16 = auVar21._0_4_;
              if (local_158._0_4_ < fVar16) break;
              lVar14 = std::chrono::_V2::steady_clock::now();
              (this->m_end).__d.__r = lVar14;
              dVar18 = (this->m_ctx->parameters).time_limit;
              if ((0.0 < dVar18) &&
                 (dVar18 < (double)(lVar14 - (this->m_begin).__d.__r) / 1000000000.0))
              goto LAB_00386137;
              auVar21 = ZEXT464((uint)fVar16);
              bVar6 = iVar8 < (this_00->parameters).pushing_iteration_limit;
              iVar8 = iVar8 + 1;
            } while (bVar6);
          }
        }
        else {
LAB_00386137:
          auVar21 = ZEXT464((uint)fVar16);
        }
        if ((local_138 & 1) != 0) break;
        iVar7 = iVar7 + 1;
        iVar13 = iVar13 + -1;
      } while (iVar7 < (this_00->parameters).pushes_limit);
    }
  }
  else {
    __return_storage_ptr__->status = limit_reached;
  }
  iVar13 = local_12c;
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    convert<baryonyx::itm::minimize_tag>
              (&this->m_best,
               (__return_storage_ptr__->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start,iVar13);
  }
  if (local_e8.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar4 = (void *)CONCAT44(local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
  ::~solver_inequalities_01coeff(&local_b0);
  if ((__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
      local_110.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl != (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0) {
    operator_delete__((void *)local_110.indices._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl);
  }
  local_110.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0;
  if ((tuple<baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
       )local_110.quadratic_elements._M_t.
        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
        .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
        _M_head_impl !=
      (_Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>)0x0) {
    operator_delete__((void *)local_110.quadratic_elements._M_t.
                              super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>
                              ._M_head_impl);
  }
  local_110.quadratic_elements._M_t.
  super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
  .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>._M_head_impl =
       (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>,_true,_true>
        )(__uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
          )0x0;
  if ((_Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>)
      local_110.linear_elements._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
      _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl != (float *)0x0) {
    operator_delete__((void *)local_110.linear_elements._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  if ((_Head_base<0UL,_unsigned_long_*,_false>)
      local_178.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__((void *)local_178.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }